

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralExpressions.cpp
# Opt level: O2

Expression *
slang::ast::IntegerLiteral::fromSyntax(Compilation *compilation,LiteralExpressionSyntax *syntax)

{
  Type *args_1;
  IntegerLiteral *pIVar1;
  bool local_39;
  SVInt val;
  Token local_28;
  
  if ((syntax->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.kind ==
      IntegerLiteralExpression) {
    parsing::Token::intValue(&local_28);
    SVInt::resize(&val,(bitwidth_t)&local_28);
    SVInt::~SVInt((SVInt *)&local_28);
    val.super_SVIntStorage.signFlag = true;
    args_1 = compilation->intType;
    local_39 = true;
    local_28 = (Token)slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    pIVar1 = BumpAllocator::
             emplace<slang::ast::IntegerLiteral,slang::ast::Compilation&,slang::ast::Type_const&,slang::SVInt,bool,slang::SourceRange>
                       (&compilation->super_BumpAllocator,compilation,args_1,&val,&local_39,
                        (SourceRange *)&local_28);
    SVInt::~SVInt(&val);
    return &pIVar1->super_Expression;
  }
  assert::assertFailed
            ("syntax.kind == SyntaxKind::IntegerLiteralExpression",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/LiteralExpressions.cpp"
             ,0x25,
             "static Expression &slang::ast::IntegerLiteral::fromSyntax(Compilation &, const LiteralExpressionSyntax &)"
            );
}

Assistant:

Expression& IntegerLiteral::fromSyntax(Compilation& compilation,
                                       const LiteralExpressionSyntax& syntax) {
    ASSERT(syntax.kind == SyntaxKind::IntegerLiteralExpression);

    SVInt val = syntax.literal.intValue().resize(32);
    val.setSigned(true);

    return *compilation.emplace<IntegerLiteral>(compilation, compilation.getIntType(),
                                                std::move(val), true, syntax.sourceRange());
}